

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool prvTidyIsCSS1Selector(ctmbstr buf)

{
  ushort **ppuVar1;
  bool bVar2;
  bool local_23;
  bool local_22;
  int local_20;
  byte local_19;
  int pos;
  Bool BStack_14;
  byte c;
  int esclen;
  Bool valid;
  ctmbstr buf_local;
  
  BStack_14 = yes;
  pos = 0;
  local_20 = 0;
  _esclen = (byte *)buf;
  while( true ) {
    bVar2 = false;
    if (BStack_14 != no) {
      local_19 = *_esclen;
      bVar2 = local_19 != 0;
      _esclen = _esclen + 1;
    }
    if (!bVar2) break;
    if (local_19 == 0x5c) {
      pos = 1;
    }
    else {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)(uint)local_19] & 0x800) == 0) {
        local_23 = true;
        if ((pos < 1) && ((local_20 < 1 || (local_23 = true, local_19 != 0x2d)))) {
          ppuVar1 = __ctype_b_loc();
          local_23 = true;
          if (((*ppuVar1)[(int)(uint)local_19] & 0x400) == 0) {
            local_23 = 0xa0 < local_19;
          }
        }
        BStack_14 = (Bool)local_23;
        pos = 0;
      }
      else {
        if (0 < pos) {
          pos = pos + 1;
          BStack_14 = (Bool)(pos < 6);
        }
        if (BStack_14 != no) {
          local_22 = 0 < local_20 || 0 < pos;
          BStack_14 = (Bool)local_22;
        }
      }
    }
    local_20 = local_20 + 1;
  }
  return BStack_14;
}

Assistant:

Bool TY_(IsCSS1Selector)( ctmbstr buf )
{
    Bool valid = yes;
    int esclen = 0;
    byte c;
    int pos;

    for ( pos=0; valid && (c = *buf++); ++pos )
    {
        if ( c == '\\' )
        {
            esclen = 1;  /* ab\555\444 is 4 chars {'a', 'b', \555, \444} */
        }
        else if ( isdigit( c ) )
        {
            /* Digit not 1st, unless escaped (Max length "\112F") */
            if ( esclen > 0 )
                valid = ( ++esclen < 6 );
            if ( valid )
                valid = ( pos>0 || esclen>0 );
        }
        else
        {
            valid = (
                esclen > 0                       /* Escaped? Anything goes. */
                || ( pos>0 && c == '-' )         /* Dash cannot be 1st char */
                || isalpha(c)                    /* a-z, A-Z anywhere */
                || ( c >= 161 )                  /* Unicode 161-255 anywhere */
            );
            esclen = 0;
        }
    }
    return valid;
}